

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O0

bool __thiscall common::SettingsSpan::last_negated(SettingsSpan *this)

{
  long lVar1;
  long in_RDI;
  long in_FS_OFFSET;
  uint7 in_stack_ffffffffffffffe8;
  bool bVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  if (*(long *)(in_RDI + 8) != 0) {
    bVar2 = UniValue::isFalse((UniValue *)(ulong)in_stack_ffffffffffffffe8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool SettingsSpan::last_negated() const { return size > 0 && data[size - 1].isFalse(); }